

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O0

void __thiscall Token_stream::ignore(Token_stream *this,char c)

{
  char cVar1;
  char ch;
  char c_local;
  Token_stream *this_local;
  
  if (((this->full & 1U) == 0) || (c != (this->buffer).kind)) {
    this->full = false;
    do {
      cVar1 = std::istream::get();
      if (cVar1 == c) {
        return;
      }
    } while (cVar1 != '\n');
  }
  else {
    this->full = false;
  }
  return;
}

Assistant:

void Token_stream::ignore(char c)
{
	if (full && c == buffer.kind)
	{
		full = false;
		return;
	}
	full = false;

	char ch;
	while (true)
	{
		ch = is.get();
		if (ch == c || ch == '\n')
			return;
	}
}